

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strxfrm.c
# Opt level: O3

size_t strxfrm(char *__dest,char *__src,size_t __n)

{
  char cVar1;
  size_t sVar2;
  size_t sVar3;
  
  sVar2 = strlen(__src);
  if (sVar2 < __n) {
    sVar3 = 0;
    do {
      if (__n == sVar3) {
        return sVar2;
      }
      cVar1 = __src[sVar3];
      __dest[sVar3] = cVar1;
      sVar3 = sVar3 + 1;
    } while (cVar1 != '\0');
  }
  return sVar2;
}

Assistant:

size_t strxfrm( char * _PDCLIB_restrict s1, const char * _PDCLIB_restrict s2, size_t n )
{
    size_t len = strlen( s2 );

    if ( len < n )
    {
        /* Cannot use strncpy() here as the filling of s1 with '\0' is not part
           of the spec.
        */
        /* FIXME: This should access _PDCLIB_lc_collate. */
        while ( n-- && ( *s1++ = ( unsigned char )*s2++ ) )
        {
            /* EMPTY */
        }
    }

    return len;
}